

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool IsWindowContentHoverable(ImGuiWindow *window,ImGuiHoveredFlags flags)

{
  ImGuiWindow *potential_parent;
  bool bVar1;
  uint in_ESI;
  long in_RDI;
  bool want_inhibit;
  ImGuiWindow *focused_root_window;
  ImGuiContext *g;
  
  if ((((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
       (potential_parent = GImGui->NavWindow->RootWindow, potential_parent != (ImGuiWindow *)0x0))
      && ((potential_parent->WasActive & 1U) != 0)) &&
     (potential_parent != *(ImGuiWindow **)(in_RDI + 0x358))) {
    bVar1 = false;
    if ((potential_parent->Flags & 0x8000000U) == 0) {
      if (((potential_parent->Flags & 0x4000000U) != 0) && ((in_ESI & 0x20) == 0)) {
        bVar1 = true;
      }
    }
    else {
      bVar1 = true;
    }
    if ((bVar1) &&
       (bVar1 = ImGui::IsWindowWithinBeginStackOf
                          (*(ImGuiWindow **)(in_RDI + 0x358),potential_parent), !bVar1)) {
      return false;
    }
  }
  return true;
}

Assistant:

static inline bool IsWindowContentHoverable(ImGuiWindow* window, ImGuiHoveredFlags flags)
{
    // An active popup disable hovering on other windows (apart from its own children)
    // FIXME-OPT: This could be cached/stored within the window.
    ImGuiContext& g = *GImGui;
    if (g.NavWindow)
        if (ImGuiWindow* focused_root_window = g.NavWindow->RootWindow)
            if (focused_root_window->WasActive && focused_root_window != window->RootWindow)
            {
                // For the purpose of those flags we differentiate "standard popup" from "modal popup"
                // NB: The 'else' is important because Modal windows are also Popups.
                bool want_inhibit = false;
                if (focused_root_window->Flags & ImGuiWindowFlags_Modal)
                    want_inhibit = true;
                else if ((focused_root_window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiHoveredFlags_AllowWhenBlockedByPopup))
                    want_inhibit = true;

                // Inhibit hover unless the window is within the stack of our modal/popup
                if (want_inhibit)
                    if (!ImGui::IsWindowWithinBeginStackOf(window->RootWindow, focused_root_window))
                        return false;
            }
    return true;
}